

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_debug.c
# Opt level: O0

int jas_memdump(FILE *out,void *data,size_t len)

{
  uchar *dp;
  size_t j;
  size_t i;
  size_t len_local;
  void *data_local;
  FILE *out_local;
  
  for (j = 0; j < len; j = j + 0x10) {
    fprintf((FILE *)out,"%04zx:",j);
    for (dp = (uchar *)0x0; dp < (uchar *)0x10; dp = dp + 1) {
      if (dp + j < len) {
        fprintf((FILE *)out," %02x",(ulong)*(byte *)((long)data + (long)(dp + j)));
      }
    }
    fprintf((FILE *)out,"\n");
  }
  return 0;
}

Assistant:

int jas_memdump(FILE *out, void *data, size_t len)
{
	size_t i;
	size_t j;
	jas_uchar *dp;
	dp = data;
	for (i = 0; i < len; i += 16) {
		fprintf(out, "%04zx:", i);
		for (j = 0; j < 16; ++j) {
			if (i + j < len) {
				fprintf(out, " %02x", dp[i + j]);
			}
		}
		fprintf(out, "\n");
	}
	return 0;
}